

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathObjectPtr xmlXPathCacheConvertString(xmlXPathContextPtr ctxt,xmlXPathObjectPtr val)

{
  xmlGenericErrorFunc p_Var1;
  xmlChar *val_00;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlXPathObjectPtr pxVar4;
  char *cur;
  
  switch(val->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    val_00 = xmlXPathCastNodeSetToString(val->nodesetval);
    break;
  case XPATH_BOOLEAN:
    cur = "true";
    if (val->boolval == 0) {
      cur = "false";
    }
    val_00 = xmlStrdup((xmlChar *)cur);
    break;
  case XPATH_NUMBER:
    val_00 = xmlXPathCastNumberToString(val->floatval);
    break;
  case XPATH_STRING:
    return val;
  case XPATH_USERS:
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xpath.c",
              0xaa2);
  default:
    xmlXPathReleaseObject(ctxt,val);
    goto LAB_001db4c3;
  }
  xmlXPathReleaseObject(ctxt,val);
  if (val_00 != (xmlChar *)0x0) {
    pxVar4 = xmlXPathCacheWrapString(ctxt,val_00);
    return pxVar4;
  }
LAB_001db4c3:
  pxVar4 = xmlXPathCacheNewCString(ctxt,(char *)val);
  return pxVar4;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheConvertString(xmlXPathContextPtr ctxt, xmlXPathObjectPtr val) {
    xmlChar *res = NULL;

    if (val == NULL)
	return(xmlXPathCacheNewCString(ctxt, ""));

    switch (val->type) {
    case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
	xmlGenericError(xmlGenericErrorContext, "STRING: undefined\n");
#endif
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
	res = xmlXPathCastNodeSetToString(val->nodesetval);
	break;
    case XPATH_STRING:
	return(val);
    case XPATH_BOOLEAN:
	res = xmlXPathCastBooleanToString(val->boolval);
	break;
    case XPATH_NUMBER:
	res = xmlXPathCastNumberToString(val->floatval);
	break;
    case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
    case XPATH_POINT:
    case XPATH_RANGE:
    case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
	TODO;
	break;
    }
    xmlXPathReleaseObject(ctxt, val);
    if (res == NULL)
	return(xmlXPathCacheNewCString(ctxt, ""));
    return(xmlXPathCacheWrapString(ctxt, res));
}